

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void TableSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  ImGuiTableSettings *this;
  ImGuiTextBuffer *in_RDX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 uVar1;
  undefined8 *in_RSI;
  ImGuiTableSettings *in_RDI;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int column_n;
  ImGuiTableColumnSettings *column;
  bool save_sort;
  bool save_order;
  bool save_visible;
  bool save_size;
  ImGuiTableSettings *settings;
  ImGuiContext *g;
  ImGuiTextBuffer *in_stack_ffffffffffffffa8;
  ImGuiTextBuffer *this_00;
  uint in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb6;
  char in_stack_ffffffffffffffb7;
  uint local_3c;
  ImGuiTableColumnSettings *local_38;
  undefined4 in_stack_ffffffffffffffd0;
  
  this = ImChunkStream<ImGuiTableSettings>::begin
                   ((ImChunkStream<ImGuiTableSettings> *)&in_RDI[0x2f3].RefScale);
  while (this != (ImGuiTableSettings *)0x0) {
    if (this->ID != 0) {
      bVar2 = (this->SaveFlags & 1U) != 0;
      bVar3 = (this->SaveFlags & 4U) != 0;
      bVar4 = (this->SaveFlags & 2U) != 0;
      bVar5 = (this->SaveFlags & 8U) != 0;
      if (((((bool)bVar2) || ((bool)bVar3)) || ((bool)bVar4)) || ((bool)bVar5)) {
        ImGuiTextBuffer::size(in_RDX);
        ImGuiTextBuffer::reserve
                  ((ImGuiTextBuffer *)
                   CONCAT17(in_stack_ffffffffffffffb7,
                            CONCAT16(in_stack_ffffffffffffffb6,
                                     CONCAT24(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)))
                   ,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
        ImGuiTextBuffer::appendf
                  (in_RDX,"[%s][0x%08X,%d]\n",*in_RSI,(ulong)this->ID,
                   (ulong)(uint)(int)this->ColumnsCount);
        if ((this->RefScale != 0.0) || (NAN(this->RefScale))) {
          ImGuiTextBuffer::appendf
                    ((ImGuiTextBuffer *)(double)this->RefScale,(char *)in_RDX,"RefScale=%g\n");
        }
        local_38 = ImGuiTableSettings::GetColumnSettings(this);
        for (local_3c = 0; (int)local_3c < (int)this->ColumnsCount; local_3c = local_3c + 1) {
          ImGuiTextBuffer::appendf(in_RDX,"Column %-2d",(ulong)local_3c);
          uVar1 = extraout_var;
          this_00 = in_RDX;
          if (local_38->UserID != 0) {
            ImGuiTextBuffer::appendf(in_RDX," UserID=%08X",(ulong)local_38->UserID);
            uVar1 = extraout_var_00;
            this_00 = in_RDX;
          }
          if (((bVar2 & 1) != 0) && (((byte)local_38->field_0xb >> 3 & 1) != 0)) {
            ImGuiTextBuffer::appendf
                      ((ImGuiTextBuffer *)(double)local_38->WidthOrWeight,(char *)this_00,
                       " Weight=%.4f");
            uVar1 = extraout_var_01;
          }
          if (((bVar2 & 1) != 0) && (((byte)local_38->field_0xb >> 3 & 1) == 0)) {
            ImGuiTextBuffer::appendf
                      (this_00," Width=%d",CONCAT44(uVar1,(int)local_38->WidthOrWeight));
          }
          if ((bVar3 & 1) != 0) {
            ImGuiTextBuffer::appendf
                      (this_00," Visible=%d",(ulong)((byte)local_38->field_0xb >> 2 & 1));
          }
          if ((bVar4 & 1) != 0) {
            ImGuiTextBuffer::appendf(this_00," Order=%d",(ulong)(uint)(int)local_38->DisplayOrder);
          }
          in_RDX = this_00;
          if (((bVar5 & 1) != 0) && (local_38->SortOrder != -1)) {
            in_stack_ffffffffffffffb0 = (uint)local_38->SortOrder;
            in_stack_ffffffffffffffb6 = 0x5e;
            in_stack_ffffffffffffffb7 = 'v';
            if ((local_38->field_0xb & 3) != 1) {
              in_stack_ffffffffffffffb7 = '^';
            }
            ImGuiTextBuffer::appendf
                      (this_00," Sort=%d%c",(ulong)in_stack_ffffffffffffffb0,
                       (ulong)(uint)(int)in_stack_ffffffffffffffb7);
            in_stack_ffffffffffffffa8 = this_00;
          }
          ImGuiTextBuffer::append
                    ((ImGuiTextBuffer *)in_RDI,(char *)this,
                     (char *)CONCAT17(bVar2,CONCAT16(bVar3,CONCAT15(bVar4,CONCAT14(bVar5,
                                                  in_stack_ffffffffffffffd0)))));
          local_38 = local_38 + 1;
        }
        ImGuiTextBuffer::append
                  ((ImGuiTextBuffer *)in_RDI,(char *)this,
                   (char *)CONCAT17(bVar2,CONCAT16(bVar3,CONCAT15(bVar4,CONCAT14(bVar5,
                                                  in_stack_ffffffffffffffd0)))));
      }
    }
    this = ImChunkStream<ImGuiTableSettings>::next_chunk
                     ((ImChunkStream<ImGuiTableSettings> *)in_RDX,in_RDI);
  }
  return;
}

Assistant:

static void TableSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    ImGuiContext& g = *ctx;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
    {
        if (settings->ID == 0) // Skip ditched settings
            continue;

        // TableSaveSettings() may clear some of those flags when we establish that the data can be stripped
        // (e.g. Order was unchanged)
        const bool save_size    = (settings->SaveFlags & ImGuiTableFlags_Resizable) != 0;
        const bool save_visible = (settings->SaveFlags & ImGuiTableFlags_Hideable) != 0;
        const bool save_order   = (settings->SaveFlags & ImGuiTableFlags_Reorderable) != 0;
        const bool save_sort    = (settings->SaveFlags & ImGuiTableFlags_Sortable) != 0;
        if (!save_size && !save_visible && !save_order && !save_sort)
            continue;

        buf->reserve(buf->size() + 30 + settings->ColumnsCount * 50); // ballpark reserve
        buf->appendf("[%s][0x%08X,%d]\n", handler->TypeName, settings->ID, settings->ColumnsCount);
        if (settings->RefScale != 0.0f)
            buf->appendf("RefScale=%g\n", settings->RefScale);
        ImGuiTableColumnSettings* column = settings->GetColumnSettings();
        for (int column_n = 0; column_n < settings->ColumnsCount; column_n++, column++)
        {
            // "Column 0  UserID=0x42AD2D21 Width=100 Visible=1 Order=0 Sort=0v"
            buf->appendf("Column %-2d", column_n);
            if (column->UserID != 0)                    buf->appendf(" UserID=%08X", column->UserID);
            if (save_size && column->IsStretch)         buf->appendf(" Weight=%.4f", column->WidthOrWeight);
            if (save_size && !column->IsStretch)        buf->appendf(" Width=%d", (int)column->WidthOrWeight);
            if (save_visible)                           buf->appendf(" Visible=%d", column->IsEnabled);
            if (save_order)                             buf->appendf(" Order=%d", column->DisplayOrder);
            if (save_sort && column->SortOrder != -1)   buf->appendf(" Sort=%d%c", column->SortOrder, (column->SortDirection == ImGuiSortDirection_Ascending) ? 'v' : '^');
            buf->append("\n");
        }
        buf->append("\n");
    }
}